

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_short>::var_node_update
          (RateAdaptiveCode<unsigned_short> *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_v,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *msg_c,vector<double,_std::allocator<double>_> *llrs)

{
  ushort uVar1;
  size_type __n;
  double dVar2;
  const_reference pvVar3;
  const_iterator __first;
  const_iterator __last;
  const_reference pvVar4;
  const_reference pvVar5;
  double dVar6;
  const_reference pvVar7;
  reference this_00;
  reference pvVar8;
  reference pvVar9;
  unsigned_short curr_pos_cn;
  double msg;
  size_t k;
  double mv_sum;
  size_t m;
  allocator<unsigned_short> local_41;
  undefined1 local_40 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> mv_position;
  vector<double,_std::allocator<double>_> *llrs_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *msg_c_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *msg_v_local;
  RateAdaptiveCode<unsigned_short> *this_local;
  
  __n = this->n_cols;
  mv_position.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)llrs;
  std::allocator<unsigned_short>::allocator(&local_41);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_40,__n,&local_41);
  std::allocator<unsigned_short>::~allocator(&local_41);
  mv_sum = 0.0;
  while( true ) {
    dVar2 = (double)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)
                               mv_position.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((ulong)dVar2 <= (ulong)mv_sum) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](msg_c,(size_type)mv_sum);
    __first = std::vector<double,_std::allocator<double>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](msg_c,(size_type)mv_sum);
    __last = std::vector<double,_std::allocator<double>_>::end(pvVar3);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        mv_position.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(size_type)mv_sum);
    dVar2 = std::
            accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__last._M_current,*pvVar4);
    msg = 0.0;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[](&this->pos_checkn,(size_type)mv_sum);
      dVar6 = (double)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar5);
      if ((ulong)dVar6 <= (ulong)msg) break;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](msg_c,(size_type)mv_sum);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(size_type)msg);
      dVar6 = *pvVar4;
      pvVar5 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[](&this->pos_checkn,(size_type)mv_sum);
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (pvVar5,(size_type)msg);
      uVar1 = *pvVar7;
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](msg_v,(ulong)uVar1);
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_40,
                          (ulong)uVar1);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)*pvVar8);
      *pvVar9 = dVar2 - dVar6;
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_40,
                          (ulong)uVar1);
      *pvVar8 = *pvVar8 + 1;
      msg = (double)((long)msg + 1);
    }
    mv_sum = (double)((long)mv_sum + 1);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_40);
  return;
}

Assistant:

void var_node_update(std::vector<std::vector<double>> &msg_v,
                             const std::vector<std::vector<double>> &msg_c,
                             const std::vector<double> &llrs) const {
            std::vector<idx_t> mv_position(n_cols);

            for (std::size_t m{}; m < llrs.size(); ++m) {
                const double mv_sum = std::accumulate(msg_c[m].begin(), msg_c[m].end(), llrs[m]);

                // Note: pos_checkn[m].size() = var_node_degs[m]
                for (std::size_t k{}; k < pos_checkn[m].size(); ++k) {
                    const double msg = mv_sum - msg_c[m][k];

                    // place the message at the correct position in the output array
                    const idx_t curr_pos_cn = pos_checkn[m][k];
                    msg_v[curr_pos_cn][mv_position[curr_pos_cn]] = msg;
                    mv_position[curr_pos_cn]++;
                }
            }
        }